

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O2

bool cbtGjkEpaSolver2::Distance
               (cbtConvexShape *shape0,cbtTransform *wtrs0,cbtConvexShape *shape1,
               cbtTransform *wtrs1,cbtVector3 *guess,sResults *results)

{
  float fVar1;
  bool bVar2;
  _ _Var3;
  code *pcVar4;
  long *plVar5;
  U i;
  ulong uVar6;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined8 uVar12;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar19 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar20 [16];
  cbtVector3 cVar21;
  undefined1 auVar22 [12];
  tShape shape;
  GJK gjk;
  cbtVector3 local_308;
  cbtVector3 local_2f8;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [16];
  cbtVector3 local_2c8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  tShape local_290;
  GJK local_200;
  undefined1 extraout_var [60];
  undefined1 auVar13 [56];
  
  gjkepa2_impl::Initialize(shape0,wtrs0,shape1,wtrs1,results,&local_290,false);
  local_200.m_nfree = 0;
  local_200.m_current = 0;
  local_200.m_ray.m_floats[0] = 0.0;
  local_200.m_ray.m_floats[1] = 0.0;
  local_200.m_ray.m_floats[2] = 0.0;
  local_200.m_ray.m_floats[3] = 0.0;
  local_200.m_status = Failed;
  local_200.m_distance = 0.0;
  _Var3 = gjkepa2_impl::GJK::Evaluate(&local_200,&local_290,guess);
  if (_Var3 == Valid) {
    auVar20 = ZEXT816(0) << 0x40;
    uVar6 = 0;
    _local_2e8 = ZEXT816(0);
    local_2f8.m_floats[0] = 0.0;
    local_2f8.m_floats[1] = 0.0;
    local_2f8.m_floats[2] = 0.0;
    local_2f8.m_floats[3] = 0.0;
    local_308.m_floats[0] = 0.0;
    local_308.m_floats[1] = 0.0;
    local_308.m_floats[2] = 0.0;
    local_308.m_floats[3] = 0.0;
    auVar8 = ZEXT416(0) << 0x40;
    auVar15 = ZEXT464(0) << 0x40;
    while( true ) {
      auVar19 = auVar15._8_56_;
      auVar13 = ZEXT856(auVar8._8_8_);
      if ((local_200.m_simplex)->rank <= uVar6) break;
      plVar5 = (long *)((long)&(local_290.m_shapes[0]->super_cbtCollisionShape).
                               _vptr_cbtCollisionShape + local_290._136_8_);
      pcVar4 = (code *)local_290.Ls;
      if ((local_290.Ls & 1) != 0) {
        pcVar4 = *(code **)(local_290.Ls + *plVar5 + -1);
      }
      local_2d8 = ZEXT416((uint)(local_200.m_simplex)->p[uVar6]);
      _local_2a8 = auVar20;
      auVar22 = (*pcVar4)(plVar5,(local_200.m_simplex)->c[uVar6]);
      fVar1 = (float)local_2d8._0_4_ * auVar22._8_4_ + auVar15._0_4_;
      local_2b8 = (float)local_2d8._0_4_;
      fStack_2b4 = (float)local_2d8._0_4_;
      fStack_2b0 = (float)local_2d8._0_4_;
      fStack_2ac = (float)local_2d8._0_4_;
      auVar7._0_4_ = (float)local_2d8._0_4_ * auVar22._0_4_;
      auVar7._4_4_ = (float)local_2d8._0_4_ * auVar22._4_4_;
      auVar7._8_4_ = (float)local_2d8._0_4_ * (float)extraout_XMM0_Qb;
      auVar7._12_4_ = (float)local_2d8._0_4_ * (float)((ulong)extraout_XMM0_Qb >> 0x20);
      auVar13 = ZEXT856(auVar7._8_8_);
      local_2e8._0_4_ = (float)local_2e8._0_4_ + auVar7._0_4_;
      local_2e8._4_4_ = (float)local_2e8._4_4_ + auVar7._4_4_;
      fStack_2e0 = fStack_2e0 + auVar7._8_4_;
      fStack_2dc = fStack_2dc + auVar7._12_4_;
      auVar19 = ZEXT856(local_2e8._8_8_);
      local_2f8.m_floats._0_8_ = vmovlps_avx(_local_2e8);
      local_2f8.m_floats[2] = fVar1;
      cVar21 = ::operator-(&(local_200.m_simplex)->c[uVar6]->d);
      auVar16._0_8_ = cVar21.m_floats._8_8_;
      auVar16._8_56_ = auVar19;
      auVar9._0_8_ = cVar21.m_floats._0_8_;
      auVar9._8_56_ = auVar13;
      local_2c8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar9._0_16_,auVar16._0_16_);
      uVar12 = local_2c8.m_floats._8_8_;
      cVar21 = gjkepa2_impl::MinkowskiDiff::Support1(&local_290,&local_2c8);
      uVar6 = uVar6 + 1;
      local_308.m_floats[2] = cVar21.m_floats[2] * (float)local_2d8._0_4_ + auVar8._0_4_;
      auVar15 = ZEXT464((uint)fVar1);
      auVar20._0_4_ = (float)local_2a8._0_4_ + cVar21.m_floats[0] * local_2b8;
      auVar20._4_4_ = (float)local_2a8._4_4_ + cVar21.m_floats[1] * fStack_2b4;
      auVar20._8_4_ = fStack_2a0 + (float)uVar12 * fStack_2b0;
      auVar20._12_4_ = fStack_29c + (float)((ulong)uVar12 >> 0x20) * fStack_2ac;
      local_308.m_floats._0_8_ = vmovlps_avx(auVar20);
      auVar8 = ZEXT416((uint)local_308.m_floats[2]);
    }
    cVar21 = cbtTransform::operator()(wtrs0,&local_2f8);
    auVar17._0_8_ = cVar21.m_floats._8_8_;
    auVar17._8_56_ = auVar19;
    auVar15._0_8_ = cVar21.m_floats._0_8_;
    auVar15._8_56_ = auVar13;
    auVar8 = vmovlhps_avx(auVar15._0_16_,auVar17._0_16_);
    auVar13 = ZEXT856(auVar8._8_8_);
    *(undefined1 (*) [16])results->witnesses[0].m_floats = auVar8;
    cVar21 = cbtTransform::operator()(wtrs0,&local_308);
    auVar18._0_8_ = cVar21.m_floats._8_8_;
    auVar18._8_56_ = auVar19;
    auVar10._0_8_ = cVar21.m_floats._0_8_;
    auVar10._8_56_ = auVar13;
    auVar8 = vmovlhps_avx(auVar10._0_16_,auVar18._0_16_);
    *(undefined1 (*) [16])results->witnesses[1].m_floats = auVar8;
    auVar8._8_8_ = 0;
    auVar8._0_4_ = local_2f8.m_floats[0];
    auVar8._4_4_ = local_2f8.m_floats[1];
    auVar14._8_8_ = 0;
    auVar14._0_4_ = local_308.m_floats[0];
    auVar14._4_4_ = local_308.m_floats[1];
    auVar8 = vsubps_avx(auVar8,auVar14);
    auVar8 = vinsertps_avx(auVar8,ZEXT416((uint)(local_2f8.m_floats[2] - local_308.m_floats[2])),
                           0x28);
    *(undefined1 (*) [16])(results->normal).m_floats = auVar8;
    auVar11._0_4_ = cbtVector3::length(&results->normal);
    auVar11._4_60_ = extraout_var;
    uVar12 = vcmpss_avx512f(auVar11._0_16_,ZEXT416(0x38d1b717),0xe);
    bVar2 = (bool)((byte)uVar12 & 1);
    results->distance = auVar11._0_4_;
    local_2c8.m_floats[0] =
         (cbtScalar)((uint)bVar2 * (int)auVar11._0_4_ + (uint)!bVar2 * 0x3f800000);
    cbtVector3::operator/=(&results->normal,local_2c8.m_floats);
  }
  else {
    results->status = (_Var3 != Inside) + Penetrating;
  }
  return _Var3 == Valid;
}

Assistant:

bool cbtGjkEpaSolver2::Distance(const cbtConvexShape* shape0,
							   const cbtTransform& wtrs0,
							   const cbtConvexShape* shape1,
							   const cbtTransform& wtrs1,
							   const cbtVector3& guess,
							   sResults& results)
{
	tShape shape;
	Initialize(shape0, wtrs0, shape1, wtrs1, results, shape, false);
	GJK gjk;
	GJK::eStatus::_ gjk_status = gjk.Evaluate(shape, guess);
	if (gjk_status == GJK::eStatus::Valid)
	{
		cbtVector3 w0 = cbtVector3(0, 0, 0);
		cbtVector3 w1 = cbtVector3(0, 0, 0);
		for (U i = 0; i < gjk.m_simplex->rank; ++i)
		{
			const cbtScalar p = gjk.m_simplex->p[i];
			w0 += shape.Support(gjk.m_simplex->c[i]->d, 0) * p;
			w1 += shape.Support(-gjk.m_simplex->c[i]->d, 1) * p;
		}
		results.witnesses[0] = wtrs0 * w0;
		results.witnesses[1] = wtrs0 * w1;
		results.normal = w0 - w1;
		results.distance = results.normal.length();
		results.normal /= results.distance > GJK_MIN_DISTANCE ? results.distance : 1;
		return (true);
	}
	else
	{
		results.status = gjk_status == GJK::eStatus::Inside ? sResults::Penetrating : sResults::GJK_Failed;
		return (false);
	}
}